

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O1

void ymf278b_alloc_rom(void *info,UINT32 memsize)

{
  void *__s;
  YMF278BChip *chip;
  
  if (*(UINT32 *)((long)info + 0x568) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)info + 0x570),(ulong)memsize);
  *(void **)((long)info + 0x570) = __s;
  *(UINT32 *)((long)info + 0x568) = memsize;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void ymf278b_alloc_rom(void* info, UINT32 memsize)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	
	if (chip->ROMSize == memsize)
		return;
	
	chip->rom = (UINT8*)realloc(chip->rom, memsize);
	chip->ROMSize = memsize;
	memset(chip->rom, 0xFF, memsize);
	
	return;
}